

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# launcher.cxx
# Opt level: O0

int __thiscall
nuraft::raft_launcher::init
          (raft_launcher *this,ptr<state_machine> *sm,ptr<state_mgr> *smgr,ptr<logger> *lg,
          int port_number,options *asio_options,raft_params *params_given,init_options *opt)

{
  bool bVar1;
  element_type *peVar2;
  undefined4 in_register_00000084;
  ptr<rpc_client_factory> *cli_factory;
  context *ctx;
  ptr<rpc_client_factory> rpc_cli_factory;
  ptr<delayed_task_scheduler> scheduler;
  shared_ptr<nuraft::asio_service> *in_stack_ffffffffffffff08;
  shared_ptr<nuraft::raft_server> *__r;
  shared_ptr<nuraft::asio_service> *in_stack_ffffffffffffff10;
  asio_service_options *in_stack_ffffffffffffff18;
  ptr<rpc_listener> *in_stack_ffffffffffffff68;
  ptr<state_machine> *in_stack_ffffffffffffff70;
  ptr<logger> *in_stack_ffffffffffffff78;
  undefined6 in_stack_ffffffffffffff80;
  ushort in_stack_ffffffffffffff86;
  asio_service *in_stack_ffffffffffffff88;
  ptr<delayed_task_scheduler> *in_stack_ffffffffffffff90;
  raft_params *in_stack_ffffffffffffff98;
  shared_ptr<nuraft::raft_server> local_60 [3];
  undefined4 local_2c;
  ptr<rpc_client_factory> *local_28;
  ptr<logger> *local_20;
  ptr<state_mgr> *local_18;
  ptr<state_machine> *local_10;
  raft_launcher *local_8;
  
  cli_factory = (ptr<rpc_client_factory> *)CONCAT44(in_register_00000084,port_number);
  local_2c = SUB84(asio_options,0);
  local_28 = cli_factory;
  local_20 = lg;
  local_18 = smgr;
  local_10 = sm;
  local_8 = this;
  cs_new<nuraft::asio_service,nuraft::asio_service_options_const&,std::shared_ptr<nuraft::logger>&>
            (in_stack_ffffffffffffff18,(shared_ptr<nuraft::logger> *)in_stack_ffffffffffffff10);
  std::shared_ptr<nuraft::asio_service>::operator=
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::shared_ptr<nuraft::asio_service>::~shared_ptr((shared_ptr<nuraft::asio_service> *)0x20c594);
  std::__shared_ptr_access<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x20c59e);
  asio_service::create_rpc_listener
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff86,in_stack_ffffffffffffff78);
  std::shared_ptr<nuraft::rpc_listener>::operator=
            ((shared_ptr<nuraft::rpc_listener> *)in_stack_ffffffffffffff10,
             (shared_ptr<nuraft::rpc_listener> *)in_stack_ffffffffffffff08);
  std::shared_ptr<nuraft::rpc_listener>::~shared_ptr((shared_ptr<nuraft::rpc_listener> *)0x20c5e0);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)((ptr<logger> *)sm + 1));
  if (bVar1) {
    std::shared_ptr<nuraft::delayed_task_scheduler>::shared_ptr<nuraft::asio_service,void>
              ((shared_ptr<nuraft::delayed_task_scheduler> *)in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff08);
    std::shared_ptr<nuraft::rpc_client_factory>::shared_ptr<nuraft::asio_service,void>
              ((shared_ptr<nuraft::rpc_client_factory> *)in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff08);
    operator_new(0xb8);
    __r = local_60;
    nuraft::context::context
              ((context *)CONCAT26(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80),
               (ptr<state_mgr> *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68,(ptr<logger> *)sm,cli_factory,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff98);
    cs_new<nuraft::raft_server,nuraft::context*&,nuraft::raft_server::init_options_const&>
              ((context **)in_stack_ffffffffffffff18,opt);
    std::shared_ptr<nuraft::raft_server>::operator=((shared_ptr<nuraft::raft_server> *)opt,__r);
    std::shared_ptr<nuraft::raft_server>::~shared_ptr((shared_ptr<nuraft::raft_server> *)0x20c6d0);
    peVar2 = std::
             __shared_ptr_access<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x20c6de);
    (*peVar2->_vptr_rpc_listener[2])(peVar2,(ptr<logger> *)sm + 2);
    std::shared_ptr<nuraft::raft_server>::shared_ptr((shared_ptr<nuraft::raft_server> *)opt,__r);
    std::shared_ptr<nuraft::rpc_client_factory>::~shared_ptr
              ((shared_ptr<nuraft::rpc_client_factory> *)0x20c711);
    std::shared_ptr<nuraft::delayed_task_scheduler>::~shared_ptr
              ((shared_ptr<nuraft::delayed_task_scheduler> *)0x20c71e);
  }
  else {
    std::shared_ptr<nuraft::raft_server>::shared_ptr
              ((shared_ptr<nuraft::raft_server> *)in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff08);
  }
  return (int)this;
}

Assistant:

ptr<raft_server> raft_launcher::init(ptr<state_machine> sm,
                                     ptr<state_mgr> smgr,
                                     ptr<logger> lg,
                                     int port_number,
                                     const asio_service::options& asio_options,
                                     const raft_params& params_given,
                                     const raft_server::init_options& opt)
{
    asio_svc_ = cs_new<asio_service>(asio_options, lg);
    asio_listener_ = asio_svc_->create_rpc_listener(port_number, lg);
    if (!asio_listener_) return nullptr;

    ptr<delayed_task_scheduler> scheduler = asio_svc_;
    ptr<rpc_client_factory> rpc_cli_factory = asio_svc_;

    context* ctx = new context( smgr,
                                sm,
                                asio_listener_,
                                lg,
                                rpc_cli_factory,
                                scheduler,
                                params_given );
    raft_instance_ = cs_new<raft_server>(ctx, opt);
    asio_listener_->listen( raft_instance_ );
    return raft_instance_;
}